

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O1

bool __thiscall
clipp::parser::try_match_joined<clipp::detail::select_all>
          (parser *this,group *joinGroup,arg_string *arg,select_all *select,arg_string *prefix)

{
  size_t __n;
  match_t *pmVar1;
  arg_mapping *this_00;
  parser *this_01;
  bool bVar2;
  int iVar3;
  long lVar4;
  arg_mapping *a;
  match_t *m;
  match_t *match_00;
  vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> matches;
  match_t match;
  parser parse;
  vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> local_2a8;
  parser *local_288;
  select_all *local_280;
  match_t local_278;
  parser local_1b8;
  scoped_dfs_traverser local_d0;
  
  local_288 = this;
  local_280 = select;
  parser(&local_1b8,joinGroup,0);
  local_2a8.super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (match_t *)0x0;
  local_2a8.super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (match_t *)0x0;
  local_2a8.super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (arg->_M_string_length != 0) {
    do {
      std::
      vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ::vector((vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                *)&local_d0,
               (vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                *)&local_1b8.pos_);
      std::
      vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ::vector(&local_d0.lastMatch_.stack_,&local_1b8.pos_.lastMatch_.stack_);
      std::
      vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ::vector(&local_d0.posAfterLastMatch_.stack_,&local_1b8.pos_.posAfterLastMatch_.stack_);
      std::
      deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
      ::deque(&local_d0.scopes_.c,&local_1b8.pos_.scopes_.c);
      local_d0.repeatGroupContinues_ = local_1b8.pos_.repeatGroupContinues_;
      local_d0.ignoreBlocks_ = local_1b8.pos_.ignoreBlocks_;
      local_d0.repeatGroupStarted_ = local_1b8.pos_.repeatGroupStarted_;
      detail::longest_prefix_match<clipp::detail::select_all>(&local_278,&local_d0,arg,local_280);
      std::
      _Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
      ::~_Deque_base((_Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                      *)&local_d0.scopes_);
      if (local_d0.posAfterLastMatch_.stack_.
          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.posAfterLastMatch_.stack_.
                        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_d0.lastMatch_.stack_.
          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.lastMatch_.stack_.
                        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_d0.pos_.stack_.
          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.pos_.stack_.
                        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_278.pos_.pos_.stack_.
          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_278.pos_.pos_.stack_.
          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        _Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
        ::~_Deque_base((_Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                        *)&local_278.pos_.scopes_);
        if (local_278.pos_.posAfterLastMatch_.stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_278.pos_.posAfterLastMatch_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_278.pos_.lastMatch_.stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_278.pos_.lastMatch_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_278.pos_.pos_.stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_278.pos_.pos_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278.str_._M_dataplus._M_p != &local_278.str_.field_2) {
          operator_delete(local_278.str_._M_dataplus._M_p);
        }
        goto LAB_0013a62b;
      }
      std::__cxx11::string::erase((ulong)arg,0);
      if ((((arg->_M_string_length != 0) && (prefix->_M_string_length != 0)) &&
          (lVar4 = std::__cxx11::string::find((char *)arg,(ulong)(prefix->_M_dataplus)._M_p,0),
          lVar4 != 0)) &&
         ((__n = prefix->_M_string_length, __n != local_278.str_._M_string_length ||
          ((__n != 0 &&
           (iVar3 = bcmp((prefix->_M_dataplus)._M_p,local_278.str_._M_dataplus._M_p,__n), iVar3 != 0
           )))))) {
        std::__cxx11::string::replace((ulong)arg,0,(char *)0x0,(ulong)(prefix->_M_dataplus)._M_p);
      }
      add_match(&local_1b8,&local_278);
      std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::
      emplace_back<clipp::detail::match_t>(&local_2a8,&local_278);
      std::
      _Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
      ::~_Deque_base((_Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                      *)&local_278.pos_.scopes_);
      if (local_278.pos_.posAfterLastMatch_.stack_.
          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_278.pos_.posAfterLastMatch_.stack_.
                        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_278.pos_.lastMatch_.stack_.
          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_278.pos_.lastMatch_.stack_.
                        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_278.pos_.pos_.stack_.
          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_278.pos_.pos_.stack_.
                        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278.str_._M_dataplus._M_p != &local_278.str_.field_2) {
        operator_delete(local_278.str_._M_dataplus._M_p);
      }
    } while (arg->_M_string_length != 0);
  }
  this_01 = local_288;
  if ((local_2a8.super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       local_2a8.super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (match_00 = local_2a8.
                 super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>
                 ._M_impl.super__Vector_impl_data._M_start,
     pmVar1 = local_2a8.
              super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>.
              _M_impl.super__Vector_impl_data._M_finish,
     this_00 = local_1b8.args_.
               super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
               ._M_impl.super__Vector_impl_data._M_start,
     local_1b8.missCand_.
     super__Vector_base<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
     ._M_impl.super__Vector_impl_data._M_start !=
     local_1b8.missCand_.
     super__Vector_base<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
LAB_0013a62b:
    bVar2 = false;
  }
  else {
    for (; local_2a8.
           super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>.
           _M_impl.super__Vector_impl_data._M_start = match_00,
        local_2a8.
        super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>._M_impl.
        super__Vector_impl_data._M_finish = pmVar1,
        this_00 !=
        local_1b8.args_.
        super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>.
        _M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
      if (((((this_00->match_).stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (this_00->match_).stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_finish) || (this_00->blocked_ != false)) ||
          (this_00->conflict_ != false)) || (bVar2 = arg_mapping::bad_repeat(this_00), bVar2))
      goto LAB_0013a62b;
      match_00 = local_2a8.
                 super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pmVar1 = local_2a8.
               super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
    bVar2 = true;
    for (; match_00 != pmVar1; match_00 = match_00 + 1) {
      add_match(this_01,match_00);
    }
  }
  std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::~vector(&local_2a8);
  std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>::
  ~vector(&local_1b8.missCand_);
  std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>::~vector
            (&local_1b8.args_);
  std::
  _Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
  ::~_Deque_base((_Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                  *)&local_1b8.pos_.scopes_);
  if (local_1b8.pos_.posAfterLastMatch_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.pos_.posAfterLastMatch_.stack_.
                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1b8.pos_.lastMatch_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.pos_.lastMatch_.stack_.
                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1b8.pos_.pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.pos_.pos_.stack_.
                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool try_match_joined(const group& joinGroup, arg_string arg,
                          const ParamSelector& select,
                          const arg_string& prefix = "")
    {
        //temporary parser with 'joinGroup' as top-level group
        parser parse {joinGroup};
        //records temporary matches
        std::vector<match_t> matches;

        while(!arg.empty()) {
            auto match = detail::longest_prefix_match(parse.pos_, arg, select);

            if(!match) return false;

            arg.erase(0, match.str().size());
            //make sure prefix is always present after the first match
            //so that, e.g., flags "-a" and "-b" will be found in "-ab"
            if(!arg.empty() && !prefix.empty() && arg.find(prefix) != 0 &&
                prefix != match.str())
            {
                arg.insert(0,prefix);
            }

            parse.add_match(match);
            matches.push_back(std::move(match));
        }

        if(!arg.empty() || matches.empty()) return false;

        if(!parse.missCand_.empty()) return false;
        for(const auto& a : parse.args_) if(a.any_error()) return false;

        //replay matches onto *this
        for(const auto& m : matches) add_match(m);
        return true;
    }